

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O1

bool tchecker::system::is_deterministic(system_t *system)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  processes_identifiers_range_t pVar3;
  const_iterator cVar4;
  long lVar5;
  integer_iterator_t<unsigned_int> pid;
  const_iterator_t cVar6;
  const_iterator cVar7;
  byte bVar8;
  ulong uVar9;
  bool bVar10;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar11;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar12;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> outevents;
  allocator<unsigned_long> local_5d;
  uint local_5c;
  const_iterator_t local_58;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  
  pVar3 = processes_t::processes_identifiers(&system->super_processes_t);
  pid = pVar3._begin._current;
  bVar10 = pid._current == pVar3._end._current._current;
  if (!bVar10) {
    rVar11 = locs_t::initial_locations(&system->super_locs_t,pid._current);
    lVar5 = (long)rVar11._end.super_const_iterator._M_current.super_const_iterator -
            (long)rVar11._begin.super_const_iterator._M_current;
    while (lVar5 < 0x11) {
      pid._current = pid._current + 1;
      bVar10 = pVar3._end._current._current == pid._current;
      if (bVar10) goto LAB_0018f522;
      rVar11 = locs_t::initial_locations(&system->super_locs_t,pid._current);
      lVar5 = (long)rVar11._end.super_const_iterator._M_current.super_const_iterator -
              (long)rVar11._begin.super_const_iterator._M_current;
    }
    if (!bVar10) {
      bVar8 = 0;
      goto LAB_0018f69b;
    }
  }
LAB_0018f522:
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_50,
             ((long)(system->super_events_t)._events_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(system->super_events_t)._events_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,0,&local_5d
            );
  rVar11 = locs_t::locations(&system->super_locs_t);
  bVar10 = (shared_ptr<tchecker::system::loc_t> *)rVar11._begin.super_const_iterator._M_current ==
           rVar11._end.super_const_iterator._M_current.super_const_iterator;
  uVar9 = CONCAT71(pVar3._1_7_,bVar10);
  if (!bVar10) {
    do {
      local_58 = rVar11._end.super_const_iterator._M_current;
      cVar6 = rVar11._begin.super_const_iterator._M_current;
      local_5c = (uint)uVar9;
      lVar5 = *(long *)cVar6.super_const_iterator._M_current;
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)cVar6.super_const_iterator._M_current + 8);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start,0,
               (long)local_50.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_50.m_bits.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start & 0xfffffffffffffff8);
      }
      rVar12 = edges_t::outgoing_edges(&system->super_edges_t,*(loc_id_t *)(lVar5 + 4));
      for (cVar4._M_current =
                (shared_ptr<tchecker::system::edge_t> *)
                rVar12._begin.super_const_iterator._M_current;
          (const_iterator)cVar4._M_current !=
          rVar12._end.super_const_iterator._M_current.super_const_iterator;
          cVar4._M_current = cVar4._M_current + 1) {
        peVar2 = ((cVar4._M_current)->
                 super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        this_00 = ((cVar4._M_current)->
                  super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        uVar1 = peVar2->_event_id;
        if ((local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0
           ) {
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          uVar9 = (ulong)local_5c;
          goto LAB_0018f671;
        }
        local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1 >> 6] =
             1L << ((byte)uVar1 & 0x3f) |
             local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar1 >> 6];
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      cVar7._M_current =
           (shared_ptr<tchecker::system::loc_t> *)
           ((long)cVar6.super_const_iterator._M_current + 0x10);
      rVar11._end.super_const_iterator._M_current = local_58.super_const_iterator._M_current;
      rVar11._begin.super_const_iterator._M_current =
           (const_iterator)(const_iterator)cVar7._M_current;
      uVar9 = CONCAT71(rVar12._end.super_const_iterator._M_current._1_7_,
                       (const_iterator)cVar7._M_current == local_58.super_const_iterator._M_current)
      ;
    } while ((const_iterator)cVar7._M_current != local_58.super_const_iterator._M_current);
  }
LAB_0018f671:
  bVar8 = (byte)uVar9;
  bVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                     (&local_50);
  if (!bVar10) {
    __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",
                  0x2be,
                  "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                 );
  }
  if (local_50.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.m_bits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0018f69b:
  return (bool)(bVar8 & 1);
}

Assistant:

bool is_deterministic(tchecker::system::system_t const & system)
{
  // Check that each process has only one initial location
  for (tchecker::process_id_t const pid : system.processes_identifiers()) {
    auto initial_locations = system.initial_locations(pid);
    if (std::distance(initial_locations.begin(), initial_locations.end()) > 1)
      return false;
  }

  // Check that every location has at most one outgoing edge for each event
  boost::dynamic_bitset<> outevents(system.events_count(), 0);
  for (tchecker::system::loc_const_shared_ptr_t l : system.locations()) {
    outevents.reset();
    for (tchecker::system::edge_const_shared_ptr_t e : system.outgoing_edges(l->id())) {
      if (outevents[e->event_id()])
        return false;
      outevents[e->event_id()] = 1;
    }
  }
  return true;
}